

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_bsp.cpp
# Opt level: O0

bool R_ClipWallSegment(int first,int last,bool solid)

{
  cliprange_t *pcVar1;
  short sVar2;
  int local_30;
  int iStack_2c;
  bool res;
  int j;
  int i;
  cliprange_t *start;
  cliprange_t *next;
  bool solid_local;
  int last_local;
  int first_local;
  
  last_local._3_1_ = false;
  for (_j = solidsegs; _j->last < first; _j = _j + 1) {
  }
  if (first < _j->first) {
    last_local._3_1_ = true;
    sVar2 = (short)first;
    if (last <= _j->first) {
      R_StoreWallRange(first,last);
      if ((fake3D & 7U) != 0) {
        return true;
      }
      if (solid) {
        if (last == _j->first) {
          _j->first = sVar2;
        }
        else {
          start = newend;
          newend = newend + 1;
          for (; start != _j; start = start + -1) {
            *start = start[-1];
          }
          start->first = sVar2;
          start->last = (short)last;
        }
      }
      return true;
    }
    R_StoreWallRange(first,(int)_j->first);
    if ((solid) && ((fake3D & 7U) == 0)) {
      _j->first = sVar2;
    }
  }
  if (_j->last < last) {
    start = _j;
    pcVar1 = start;
    do {
      start = pcVar1;
      if (last < start[1].first) {
        R_StoreWallRange((int)start->last,last);
        next._4_4_ = last;
        goto LAB_0038243e;
      }
      R_StoreWallRange((int)start->last,(int)start[1].first);
      pcVar1 = start + 1;
    } while (start[1].last < last);
    next._4_4_ = (int)start[1].last;
    start = start + 1;
LAB_0038243e:
    if ((fake3D & 7U) == 0) {
      if ((solid) && (_j->last = (short)next._4_4_, start != _j)) {
        iStack_2c = 1;
        for (local_30 = (int)((long)newend - (long)start >> 2); 0 < local_30;
            local_30 = local_30 + -1) {
          _j[iStack_2c] = start[iStack_2c];
          iStack_2c = iStack_2c + 1;
        }
        newend = _j + iStack_2c;
      }
      last_local._3_1_ = true;
    }
    else {
      last_local._3_1_ = true;
    }
  }
  return last_local._3_1_;
}

Assistant:

bool R_ClipWallSegment (int first, int last, bool solid)
{
	cliprange_t *next, *start;
	int i, j;
	bool res = false;

	// Find the first range that touches the range
	// (adjacent pixels are touching).
	start = solidsegs;
	while (start->last < first)
		start++;

	if (first < start->first)
	{
		res = true;
		if (last <= start->first)
		{
			// Post is entirely visible (above start).
			R_StoreWallRange (first, last);
			if (fake3D & FAKE3D_FAKEMASK)
			{
				return true;
			}

			// Insert a new clippost for solid walls.
			if (solid)
			{
				if (last == start->first)
				{
					start->first = first;
				}
				else
				{
					next = newend;
					newend++;
					while (next != start)
					{
						*next = *(next-1);
						next--;
					}
					next->first = first;
					next->last = last;
				}
			}
			return true;
		}

		// There is a fragment above *start.
		R_StoreWallRange (first, start->first);

		// Adjust the clip size for solid walls
		if (solid && !(fake3D & FAKE3D_FAKEMASK))
		{
			start->first = first;
		}
	}

	// Bottom contained in start?
	if (last <= start->last)
		return res;

	next = start;
	while (last >= (next+1)->first)
	{
		// There is a fragment between two posts.
		R_StoreWallRange (next->last, (next+1)->first);
		next++;
		
		if (last <= next->last)
		{
			// Bottom is contained in next.
			last = next->last;
			goto crunch;
		}
	}

	// There is a fragment after *next.
	R_StoreWallRange (next->last, last);

crunch:
	if (fake3D & FAKE3D_FAKEMASK)
	{
		return true;
	}
	if (solid)
	{
		// Adjust the clip size.
		start->last = last;

		if (next != start)
		{
			// Remove start+1 to next from the clip list,
			// because start now covers their area.
			for (i = 1, j = (int)(newend - next); j > 0; i++, j--)
			{
				start[i] = next[i];
			}
			newend = start+i;
		}
	}
	return true;
}